

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O3

bool __thiscall
Minisat::OnlineProofChecker::addClause
          (OnlineProofChecker *this,vec<Minisat::Lit> *cls,bool checkOnly)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  byte bVar1;
  iterator __position;
  uint *puVar2;
  Lit LVar3;
  bool bVar4;
  Lit *pLVar5;
  ulong uVar6;
  ostream *poVar7;
  pointer puVar8;
  int iVar9;
  anon_struct_8_10_eb538618_for_header aVar10;
  int iVar11;
  undefined7 in_register_00000011;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  pointer pvVar15;
  uint uVar16;
  uint uVar17;
  char *pcVar18;
  anon_struct_8_10_eb538618_for_header *cls_00;
  long lVar19;
  long lVar20;
  CRef ref;
  Lit resolveLit;
  Lit local_60;
  undefined4 local_5c;
  Watcher local_58;
  vec<Minisat::Lit> *local_50;
  pointer local_48;
  int local_3c;
  ulong local_38;
  
  if (this->ok != true) {
    return true;
  }
  local_5c = (undefined4)CONCAT71(in_register_00000011,checkOnly);
  iVar12 = (this->assigns).sz;
  iVar9 = cls->sz;
  if (0 < iVar9) {
    pLVar5 = cls->data;
    lVar19 = 0;
    iVar11 = iVar12;
    do {
      if (iVar11 <= pLVar5[lVar19].x >> 1) {
        do {
          newVar(this);
          iVar11 = (this->assigns).sz;
          pLVar5 = cls->data;
        } while (iVar11 <= pLVar5[lVar19].x >> 1);
        iVar9 = cls->sz;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < iVar9);
  }
  if (3 < this->verbose) {
    local_50 = (vec<Minisat::Lit> *)CONCAT44(local_50._4_4_,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"c [DRAT-OTFC] add/check clause ",0x1f);
    if (0 < cls->sz) {
      lVar19 = 0;
      do {
        uVar13 = cls->data[lVar19].x;
        uVar16 = (int)uVar13 >> 1;
        uVar17 = ~uVar16;
        if ((uVar13 & 1) == 0) {
          uVar17 = uVar16 + 1;
        }
        std::ostream::operator<<((ostream *)&std::cerr,uVar17);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
        lVar19 = lVar19 + 1;
      } while (lVar19 < cls->sz);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    printState(this);
    iVar12 = (int)local_50;
  }
  lVar19 = (long)(this->trail).sz;
  if (0 < lVar19) {
    uVar6 = lVar19 + 1;
    do {
      (this->assigns).data[(this->trail).data[uVar6 - 2].x >> 1].value = '\x02';
      uVar6 = uVar6 - 1;
    } while (1 < uVar6);
  }
  this->qhead = 0;
  if ((this->trail).data != (Lit *)0x0) {
    (this->trail).sz = 0;
  }
  iVar9 = cls->sz;
  if (0 < iVar9) {
    lVar19 = 0;
    do {
      uVar13 = cls->data[lVar19].x;
      bVar1 = (this->assigns).data[(int)uVar13 >> 1].value;
      if ((bVar1 & 2) == 0) {
        if (((byte)uVar13 & 1) == bVar1) goto LAB_00121dbd;
      }
      else {
        uncheckedEnqueue(this,(Lit)(uVar13 ^ 1));
        iVar9 = cls->sz;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < iVar9);
  }
  if (3 < this->verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"c [DRAT-OTFC] clause does not conflict by pure enquing ",0x37)
    ;
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
  }
  bVar4 = propagate(this);
  if (bVar4) {
    if (3 < this->verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"c [DRAT-OTFC] clause is DRUP ",0x1d);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
    }
LAB_00121dbd:
joined_r0x00122650:
    bVar4 = true;
    if ((byte)local_5c == '\0') {
      bVar4 = true;
      if (cls->sz == 0) {
        this->ok = false;
      }
      else {
        if (cls->sz < 2) {
          vec<Minisat::Lit>::push(&this->unitClauses,cls->data);
        }
        else {
          local_60.x = ClauseAllocator::alloc<Minisat::vec<Minisat::Lit>>(&this->ca,cls,false);
          if (0 < cls->sz) {
            lVar19 = 0;
            do {
              this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                        ((this->occ).
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + cls->data[lVar19].x);
              __position._M_current = *(uint **)(this_00 + 8);
              if (__position._M_current == *(uint **)(this_00 + 0x10)) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>(this_00,__position,(uint *)&local_60);
              }
              else {
                *__position._M_current = local_60.x;
                *(uint **)(this_00 + 8) = __position._M_current + 1;
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 < cls->sz);
          }
          LVar3.x = local_60.x;
          puVar2 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
          uVar6 = (ulong)(uint)local_60.x;
          local_58.blocker.x = puVar2[uVar6 + 3];
          local_58.cref = local_60.x;
          vec<Minisat::Watcher>::push
                    ((this->watches).occs.data + ((long)(int)puVar2[uVar6 + 2] ^ 1),&local_58);
          local_58.blocker.x = puVar2[uVar6 + 2];
          local_58.cref = LVar3.x;
          vec<Minisat::Watcher>::push
                    ((this->watches).occs.data + ((long)(int)puVar2[uVar6 + 3] ^ 1),&local_58);
          vec<unsigned_int>::push(&this->clauses,(uint *)&local_60);
        }
        bVar4 = true;
        if (1 < this->verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"c [DRAT-OTFC] added the clause ",0x1f);
          if (0 < cls->sz) {
            lVar19 = 0;
            do {
              uVar13 = cls->data[lVar19].x;
              uVar16 = (int)uVar13 >> 1;
              uVar17 = ~uVar16;
              if ((uVar13 & 1) == 0) {
                uVar17 = uVar16 + 1;
              }
              std::ostream::operator<<((ostream *)&std::cerr,uVar17);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
              lVar19 = lVar19 + 1;
            } while (lVar19 < cls->sz);
          }
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
          std::ostream::put('X');
          std::ostream::flush();
          bVar4 = true;
        }
      }
    }
  }
  else {
    if (3 < this->verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"c [DRAT-OTFC] clause is not DRUP ",0x21);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
    }
    if (this->proof == dratProof) {
      if (((byte)local_5c & cls->sz == 0) == 0) {
        if (iVar12 < cls->data->x >> 1) goto LAB_00121dbd;
        uVar13 = (this->ma).step;
        if (0x3fffffff < uVar13) {
          puVar8 = (this->ma).array.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar13 = 0;
          memset(puVar8,0,(long)(this->ma).array.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar8);
        }
        (this->ma).step = uVar13 + 1;
        if ((this->lits).data != (Lit *)0x0) {
          (this->lits).sz = 0;
        }
        local_50 = &this->lits;
        if (1 < cls->sz) {
          lVar20 = 1;
          lVar19 = 4;
          do {
            pLVar5 = cls->data;
            uVar6 = (ulong)*(uint *)((long)&pLVar5->x + lVar19);
            puVar8 = (this->ma).array.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar13 = (this->ma).step;
            if (puVar8[uVar6 ^ 1] == uVar13) goto LAB_00121dbd;
            puVar8[uVar6] = uVar13;
            vec<Minisat::Lit>::push(local_50,(Lit *)((long)&pLVar5->x + lVar19));
            lVar20 = lVar20 + 1;
            lVar19 = lVar19 + 4;
          } while (lVar20 < cls->sz);
        }
        local_3c = (this->lits).sz;
        local_58.cref = cls->data->x;
        if (this->verbose < 4) {
          pvVar15 = (this->occ).
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + ((long)(int)local_58.cref ^ 1);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"c [DRAT-OTFC] use literal ",0x1a);
          poVar7 = operator<<((ostream *)&std::cerr,(Lit *)&local_58);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," for DRAT check",0xf);
          std::endl<char,std::char_traits<char>>(poVar7);
          pvVar15 = (this->occ).
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + ((long)(int)local_58.cref ^ 1);
          if (4 < this->verbose) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"c [DRAT-OTFC] resolve against ",0x1e);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," clauses",8);
            std::endl<char,std::char_traits<char>>(poVar7);
          }
        }
        puVar8 = (pvVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&(pvVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data + 8) != puVar8) {
          uVar6 = 0;
          local_48 = pvVar15;
          do {
            (this->lits).sz = local_3c;
            cls_00 = (anon_struct_8_10_eb538618_for_header *)
                     ((this->ca).super_RegionAllocator<unsigned_int>.memory + puVar8[uVar6]);
            local_38 = uVar6;
            if (4 < this->verbose) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"c [DRAT-OTFC] resolve with clause ",0x22);
              if (0x3ffffffff < (ulong)*cls_00) {
                uVar6 = 0;
                do {
                  uVar17 = (int)*(uint *)(&cls_00[1].field_0x0 + uVar6 * 4) >> 1;
                  uVar13 = ~uVar17;
                  if ((*(uint *)(&cls_00[1].field_0x0 + uVar6 * 4) & 1) == 0) {
                    uVar13 = uVar17 + 1;
                  }
                  std::ostream::operator<<((ostream *)&std::cerr,uVar13);
                  std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                  uVar6 = uVar6 + 1;
                } while (uVar6 < (ulong)*cls_00 >> 0x22);
              }
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
              std::ostream::put('X');
              std::ostream::flush();
            }
            aVar10 = *cls_00;
            uVar6 = (ulong)aVar10 >> 0x22;
            uVar14 = 0;
            if (0x3ffffffff < (ulong)aVar10) {
              uVar14 = 0;
              do {
                uVar13 = *(uint *)(&cls_00[1].field_0x0 + uVar14 * 4);
                if ((local_58.cref ^ uVar13) != 1) {
                  puVar8 = (this->ma).array.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  uVar17 = (this->ma).step;
                  if (puVar8[(ulong)uVar13 ^ 1] == uVar17) break;
                  if (puVar8[uVar13] != uVar17) {
                    local_60.x = uVar13;
                    vec<Minisat::Lit>::push(local_50,&local_60);
                    aVar10 = *cls_00;
                  }
                }
                uVar14 = uVar14 + 1;
                uVar6 = (ulong)aVar10 >> 0x22;
              } while (uVar14 < uVar6);
            }
            if ((int)uVar14 == (int)uVar6) {
              if (3 < this->verbose) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"c [DRAT-OTFC] test resolvent ",0x1d);
                if (0 < (this->lits).sz) {
                  lVar19 = 0;
                  do {
                    uVar13 = (this->lits).data[lVar19].x;
                    uVar16 = (int)uVar13 >> 1;
                    uVar17 = ~uVar16;
                    if ((uVar13 & 1) == 0) {
                      uVar17 = uVar16 + 1;
                    }
                    std::ostream::operator<<((ostream *)&std::cerr,uVar17);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                    lVar19 = lVar19 + 1;
                  } while (lVar19 < (this->lits).sz);
                }
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
                std::ostream::put('X');
                std::ostream::flush();
              }
              lVar19 = (long)(this->trail).sz;
              if (0 < lVar19) {
                uVar6 = lVar19 + 1;
                do {
                  (this->assigns).data[(this->trail).data[uVar6 - 2].x >> 1].value = '\x02';
                  uVar6 = uVar6 - 1;
                } while (1 < uVar6);
              }
              this->qhead = 0;
              if ((this->trail).data != (Lit *)0x0) {
                (this->trail).sz = 0;
              }
              iVar12 = (this->lits).sz;
              if (0 < iVar12) {
                lVar19 = 0;
                do {
                  pvVar15 = local_48;
                  uVar13 = (this->lits).data[lVar19].x;
                  bVar1 = (this->assigns).data[(int)uVar13 >> 1].value;
                  if ((bVar1 & 2) == 0) {
                    if (((byte)uVar13 & 1) == bVar1) {
                      if (this->verbose < 5) goto LAB_001225d5;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"c [DRAT-OTFC] the clause ",0x19);
                      poVar7 = operator<<((ostream *)&std::cerr,cls);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar7," conflicts during enqueing its literals",0x27);
                      std::endl<char,std::char_traits<char>>(poVar7);
                      goto LAB_00122512;
                    }
                  }
                  else {
                    uncheckedEnqueue(this,(Lit)(uVar13 ^ 1));
                    iVar12 = (this->lits).sz;
                  }
                  lVar19 = lVar19 + 1;
                } while (lVar19 < iVar12);
              }
              bVar4 = propagate(this);
              pvVar15 = local_48;
              if (!bVar4) {
                if (1 < this->verbose) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"c [DRAT-OTFC] the clause ",0x19);
                  poVar7 = operator<<((ostream *)&std::cerr,cls);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7," is not a DRAT clause -- resolution on ",0x27);
                  poVar7 = operator<<(poVar7,(Lit *)&local_58);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7," with ",6);
                  poVar7 = operator<<(poVar7,(Clause *)cls_00);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7," failed! (does not result in a conflict with UP)",0x30);
                  std::endl<char,std::char_traits<char>>(poVar7);
                }
                goto LAB_001220ff;
              }
LAB_00122512:
              if (6 < this->verbose) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"c [DRAT-OTFC] the clause ",0x19);
                if (0 < cls->sz) {
                  lVar19 = 0;
                  do {
                    uVar13 = cls->data[lVar19].x;
                    uVar16 = (int)uVar13 >> 1;
                    uVar17 = ~uVar16;
                    if ((uVar13 & 1) == 0) {
                      uVar17 = uVar16 + 1;
                    }
                    std::ostream::operator<<((ostream *)&std::cerr,uVar17);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                    lVar19 = lVar19 + 1;
                  } while (lVar19 < cls->sz);
                }
                lVar19 = 0x26;
                pcVar18 = " conflicts during enqueing/propagating";
                goto LAB_001225a8;
              }
            }
            else {
              pvVar15 = local_48;
              if (4 < this->verbose) {
                lVar19 = 0x24;
                pcVar18 = "c [DRAT-OTFC] resolvent is tautology";
LAB_001225a8:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar18,lVar19);
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
                std::ostream::put('X');
                std::ostream::flush();
              }
            }
LAB_001225d5:
            uVar6 = local_38 + 1;
            puVar8 = (pvVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          } while (uVar6 < (ulong)((long)*(pointer *)
                                          ((long)&(pvVar15->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data + 8) -
                                   (long)puVar8 >> 2));
        }
        goto joined_r0x00122650;
      }
    }
    else {
      if (1 < this->verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"c [DRAT-OTFC] the clause ",0x19);
        if (0 < cls->sz) {
          lVar19 = 0;
          do {
            uVar13 = cls->data[lVar19].x;
            uVar16 = (int)uVar13 >> 1;
            uVar17 = ~uVar16;
            if ((uVar13 & 1) == 0) {
              uVar17 = uVar16 + 1;
            }
            std::ostream::operator<<((ostream *)&std::cerr,uVar17);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
            lVar19 = lVar19 + 1;
          } while (lVar19 < cls->sz);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," is not a DRUP clause, and we do not check DRAT",0x2f);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
      }
LAB_001220ff:
      printState(this);
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

inline bool OnlineProofChecker::addClause(const vec<Lit> &cls, bool checkOnly)
{
    if (!ok) {
        return true;
    } // trivially true, we reached the empty clause already!
    bool conflict = false;

    const int initialVars = nVars();

    // have enough variables present
    for (int i = 0; i < cls.size(); ++i) {
        while (nVars() <= var(cls[i])) {
            newVar();
        }
    }

    if (verbose > 3) {
        std::cerr << "c [DRAT-OTFC] add/check clause " << cls << std::endl;
        printState();
    }

    // enqueue all complementary literals!
    cancelUntil();
    for (int i = 0; i < cls.size(); ++i) {
        if (value(cls[i]) == l_Undef) {
            uncheckedEnqueue(~cls[i]);
        } else if (value(~cls[i]) == l_False) {
            conflict = true;
            break;
        }
    }

    if (!conflict) {
        DOUT(if (verbose > 3) std::cerr << "c [DRAT-OTFC] clause does not conflict by pure enquing " << std::endl;);
        if (propagate()) {
            conflict = true; // DRUP!
            DOUT(if (verbose > 3) std::cerr << "c [DRAT-OTFC] clause is DRUP " << std::endl;);
        } else {
            DOUT(if (verbose > 3) std::cerr << "c [DRAT-OTFC] clause is not DRUP " << std::endl;);
            if (proof == dratProof) { // are we checking DRAT?
                if (cls.size() == 0 && checkOnly) {
                    return false;
                }
                assert(cls.size() > 0 && "checking the empty clause cannot reach here (it can only be a RUP clause, "
                                         "not a RAT clause -- empty clause is not entailed");
                if (initialVars >= var(cls[0])) { // DRAT on the first variable, because this variable is not present before!
                    // build all resolents on the first literal!
                    ma.nextStep();
                    lits.clear();
                    for (int i = 1; i < cls.size(); ++i) {
                        if (ma.isCurrentStep(toInt(~cls[i]))) {
                            conflict = true;
                            break;
                        }                                 // clause has complementary literals, accept it!
                        ma.setCurrentStep(toInt(cls[i])); // mark all except the first literal!
                        lits.push(cls[i]);
                    }
                    if (!conflict) {
                        const int initialSize =
                        lits.size(); // these literals are added by resolving with  the current clause on its first literal
                        assert(initialSize + 1 == cls.size() &&
                               "initial resolvent size has all literals except the literal to resolve on");
                        const Lit resolveLit = cls[0];
                        if (verbose > 3) {
                            std::cerr << "c [DRAT-OTFC] use literal " << resolveLit << " for DRAT check" << std::endl;
                        }
                        conflict = true;
                        const std::vector<CRef> &list = occ[toInt(~resolveLit)];
                        bool resovleConflict = false;
                        if (verbose > 4) {
                            std::cerr << "c [DRAT-OTFC] resolve against " << list.size() << " clauses" << std::endl;
                        }
                        for (size_t i = 0; i < list.size(); ++i) {
                            // build resolvent
                            lits.shrink_(lits.size() - initialSize); // remove literals from previous addClause call
                            const Clause &d = ca[list[i]];
                            if (verbose > 4) {
                                std::cerr << "c [DRAT-OTFC] resolve with clause " << d << std::endl;
                            }
                            int j = 0;
                            for (; j < d.size(); ++j) {
                                if (d[j] == ~resolveLit) {
                                    continue;
                                } // this literal is used for resolution
                                if (ma.isCurrentStep(toInt(~d[j]))) {
                                    break;
                                } // resolvent is a tautology
                                if (!ma.isCurrentStep(toInt(d[j]))) {
                                    // ma.setCurrentStep( toInt(d[j]) );  // do not do this, because there are multiple
                                    // resolvents! // this step might be redundant -- however, here we can ensure that also clauses with duplicate literals can be handled, as well as tautologic clauses!
                                    lits.push(d[j]);
                                }
                            }
                            if (j != d.size()) {
                                if (verbose > 4) {
                                    std::cerr << "c [DRAT-OTFC] resolvent is tautology" << std::endl;
                                }
                                continue; // this resolvent would be tautological!
                            }
                            // lits contains all literals of the resolvent, propagate and check for the conflict!

                            if (verbose > 3) {
                                std::cerr << "c [DRAT-OTFC] test resolvent " << lits << std::endl;
                            }
                            // enqueue all complementary literals!
                            resovleConflict = false;
                            cancelUntil();
                            for (int k = 0; k < lits.size(); ++k) {
                                if (value(lits[k]) == l_Undef) {
                                    uncheckedEnqueue(~lits[k]);
                                } else if (value(~lits[k]) == l_False) {
                                    resovleConflict = true;
                                    DOUT(if (verbose > 4) std::cerr << "c [DRAT-OTFC] the clause " << cls
                                                                    << " conflicts during enqueing its literals" << std::endl;);
                                    break;
                                } // the clause itself is tautological ...
                            }
                            if (!resovleConflict && !propagate()) {
                                conflict = false; // not DRAT, the current resolvent does not lead to a conflict!
                                if (verbose > 1) {
                                    std::cerr << "c [DRAT-OTFC] the clause " << cls
                                              << " is not a DRAT clause -- resolution on " << resolveLit << " with "
                                              << d << " failed! (does not result in a conflict with UP)" << std::endl;
                                }
                                printState();
                                assert(false && "added clause has to be a DRAT clause");
                                return false;
                            } else {
                                DOUT(if (verbose > 6) std::cerr << "c [DRAT-OTFC] the clause " << cls
                                                                << " conflicts during enqueing/propagating" << std::endl;);
                            }
                        }
                        assert(conflict && "added clause has to be a DRAT clause");
                        if (!conflict) {
                            return false;
                        }
                    } // else conflict == true
                } else {
                    conflict = true;
                } // DRAT, because we have a fresh variable!
            } else {
                if (verbose > 1) {
                    std::cerr << "c [DRAT-OTFC] the clause " << cls << " is not a DRUP clause, and we do not check DRAT"
                              << std::endl;
                }
                printState();
                assert(false && "added clause has to be a DRUP clause");
                return false;
            }
        }
    }

    // do not actually add the clause
    if (checkOnly) {
        return true;
    }

    // add the clause ...
    if (cls.size() == 0) {
        ok = false;
        return true;
    }

    if (cls.size() > 1) {
        CRef ref = ca.alloc(cls, false);
        for (int i = 0; i < cls.size(); ++i) {
            occ[toInt(cls[i])].push_back(ref);
        }
        attachClause(ref);
        clauses.push(ref);
    } else {
        unitClauses.push(cls[0]);
    }
    if (verbose > 1) {
        std::cerr << "c [DRAT-OTFC] added the clause " << cls << std::endl;
    }
    return true;
}